

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  format_decimal_result<char_*> fVar4;
  char local_30 [21];
  char acStack_1b [3];
  char *local_18;
  
  lVar3 = (msg->time).__d.__r;
  uVar2 = lVar3 - (this->last_message_time_).__d.__r;
  uVar1 = 0;
  if (0 < (long)uVar2) {
    uVar1 = uVar2;
  }
  (this->last_message_time_).__d.__r = lVar3;
  fVar4 = ::fmt::v9::detail::format_decimal<char,unsigned_long>(local_30,uVar1 / 1000000,0x15);
  local_18 = fVar4.begin;
  lVar3 = (long)local_30 - (long)local_18;
  if (-0x16 < lVar3) {
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_18,local_18 + lVar3 + 0x15);
    return;
  }
  ::fmt::v9::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
             ,0x199,"negative value");
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> pattern_formatter::clone() const {
    custom_flags cloned_custom_formatters;
    for (auto &it : custom_handlers_) {
        cloned_custom_formatters[it.first] = it.second->clone();
    }
    auto cloned = details::make_unique<pattern_formatter>(pattern_, pattern_time_type_, eol_,
                                                          std::move(cloned_custom_formatters));
    cloned->need_localtime(need_localtime_);
#if defined(__GNUC__) && __GNUC__ < 5
    return std::move(cloned);
#else
    return cloned;
#endif
}